

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O2

unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
 __thiscall
spvtools::opt::ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString
          (ConvertToSampledImagePass *this,char *str)

{
  char *pcVar1;
  int iVar2;
  char cVar3;
  char *pcVar4;
  uint32_t binding;
  uint32_t descriptor_set;
  unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
  descriptor_set_binding_pairs;
  uint32_t local_48;
  uint32_t local_44;
  _Head_base<0UL,_std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_*,_false>
  local_40;
  DescriptorSetAndBinding local_38;
  
  if (str == (char *)0x0) {
    (this->super_Pass)._vptr_Pass = (_func_int **)0x0;
  }
  else {
    MakeUnique<std::vector<spvtools::opt::DescriptorSetAndBinding,std::allocator<spvtools::opt::DescriptorSetAndBinding>>>
              ();
    pcVar4 = str + -1;
    do {
      cVar3 = pcVar4[1];
      pcVar4 = pcVar4 + 1;
      iVar2 = isspace((int)cVar3);
    } while (iVar2 != 0);
    while (cVar3 != '\0') {
      local_44 = 0;
      pcVar4 = anon_unknown_18::ParseNumberUntilSeparator(pcVar4,&local_44);
      if ((pcVar4 == (char *)0x0) || (*pcVar4 != ':')) {
LAB_004cc8a1:
        (this->super_Pass)._vptr_Pass = (_func_int **)0x0;
        goto LAB_004cc8bb;
      }
      local_48 = 0;
      pcVar4 = anon_unknown_18::ParseNumberUntilSeparator(pcVar4 + 1,&local_48);
      if (pcVar4 == (char *)0x0) goto LAB_004cc8a1;
      local_38.descriptor_set = local_44;
      local_38.binding = local_48;
      std::
      vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
      ::emplace_back<spvtools::opt::DescriptorSetAndBinding>(local_40._M_head_impl,&local_38);
      pcVar4 = pcVar4 + -1;
      do {
        pcVar1 = pcVar4 + 1;
        pcVar4 = pcVar4 + 1;
        iVar2 = isspace((int)*pcVar1);
      } while (iVar2 != 0);
      cVar3 = *pcVar4;
    }
    (this->super_Pass)._vptr_Pass = (_func_int **)local_40._M_head_impl;
    local_40._M_head_impl =
         (vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
          *)0x0;
LAB_004cc8bb:
    std::
    unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
    ::~unique_ptr((unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
                   *)&local_40);
  }
  return (__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<VectorOfDescriptorSetAndBindingPairs>
ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString(
    const char* str) {
  if (!str) return nullptr;

  auto descriptor_set_binding_pairs =
      MakeUnique<VectorOfDescriptorSetAndBindingPairs>();

  while (std::isspace(*str)) str++;  // skip leading spaces.

  // The parsing loop, break when points to the end.
  while (*str) {
    // Parse the descriptor set.
    uint32_t descriptor_set = 0;
    str = ParseNumberUntilSeparator(str, &descriptor_set);
    if (str == nullptr) return nullptr;

    // Find the ':', spaces between the descriptor set and the ':' are not
    // allowed.
    if (*str++ != ':') {
      // ':' not found
      return nullptr;
    }

    // Parse the binding.
    uint32_t binding = 0;
    str = ParseNumberUntilSeparator(str, &binding);
    if (str == nullptr) return nullptr;

    descriptor_set_binding_pairs->push_back({descriptor_set, binding});

    // Skip trailing spaces.
    while (std::isspace(*str)) str++;
  }

  return descriptor_set_binding_pairs;
}